

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::SignWithSchnorrPrivkeySimple
          (TransactionContext *this,OutPoint *outpoint,Privkey *privkey,SigHashType *sighash_type,
          ByteData256 *aux_rand,ByteData *annex)

{
  ByteData256 sighash;
  SchnorrSignature signature;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  SchnorrSignature local_80;
  SchnorrSignature local_58;
  
  CreateSignatureHashByTaproot
            ((ByteData256 *)&local_98,this,outpoint,sighash_type,(ByteData256 *)0x0,(uint32_t *)0x0,
             annex);
  core::SchnorrSignature::SchnorrSignature(&local_58);
  if (aux_rand == (ByteData256 *)0x0) {
    core::SchnorrUtil::Sign(&local_80,(ByteData256 *)&local_98,privkey);
    core::SchnorrSignature::operator=(&local_58,&local_80);
  }
  else {
    core::SchnorrUtil::Sign(&local_80,(ByteData256 *)&local_98,privkey,aux_rand);
    core::SchnorrSignature::operator=(&local_58,&local_80);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
  core::SchnorrSignature::SetSigHashType(&local_58,sighash_type);
  AddSchnorrSign(this,outpoint,&local_58,annex);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void TransactionContext::SignWithSchnorrPrivkeySimple(
    const OutPoint& outpoint, const Privkey& privkey,
    const SigHashType& sighash_type, const ByteData256* aux_rand,
    const ByteData* annex) {
  auto sighash =
      CreateSignatureHashByTaproot(outpoint, sighash_type, nullptr, 0, annex);
  SchnorrSignature signature;
  if (aux_rand != nullptr) {
    signature = SchnorrUtil::Sign(sighash, privkey, *aux_rand);
  } else {
    signature = SchnorrUtil::Sign(sighash, privkey);
  }
  signature.SetSigHashType(sighash_type);
  AddSchnorrSign(outpoint, signature, annex);
}